

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

TemplateCache * __thiscall ctemplate::TemplateCache::Clone(TemplateCache *this)

{
  Mutex *this_00;
  TemplateCache *this_01;
  __node_base *p_Var1;
  
  this_00 = this->mutex_;
  Mutex::ReaderLock(this_00);
  this_01 = (TemplateCache *)operator_new(0x40);
  TemplateCache(this_01);
  std::
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&this_01->parsed_template_cache_->_M_h,&this->parsed_template_cache_->_M_h);
  p_Var1 = &(this->parsed_template_cache_->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    RefcountedTemplate::IncRef((RefcountedTemplate *)p_Var1[3]._M_nxt);
  }
  Mutex::ReaderUnlock(this_00);
  return this_01;
}

Assistant:

TemplateCache* TemplateCache::Clone() const {
  ReaderMutexLock ml(mutex_);
  TemplateCache* new_cache = new TemplateCache();
  *(new_cache->parsed_template_cache_) = *parsed_template_cache_;
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end(); ++it) {
    it->second.refcounted_tpl->IncRef();
  }

  return new_cache;
}